

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
kj::anon_unknown_36::WebSocketImpl::Header::compose
          (Header *this,bool fin,bool compressed,byte opcode,uint64_t payloadLen,Mask mask)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<unsigned_char> local_58;
  size_t local_48;
  size_t fill;
  uint64_t uStack_38;
  bool hasMask;
  uint64_t payloadLen_local;
  byte opcode_local;
  bool compressed_local;
  Header *pHStack_28;
  bool fin_local;
  Header *this_local;
  Mask mask_local;
  
  bVar2 = 0;
  if (fin) {
    bVar2 = 0x80;
  }
  bVar4 = 0;
  if (compressed) {
    bVar4 = 0x40;
  }
  this->bytes[0] = bVar2 | bVar4 | opcode;
  uStack_38 = payloadLen;
  payloadLen_local._5_1_ = opcode;
  payloadLen_local._6_1_ = compressed;
  payloadLen_local._7_1_ = fin;
  pHStack_28 = this;
  this_local._4_4_ = mask.maskBytes;
  bVar1 = Mask::isZero((Mask *)((long)&this_local + 4));
  fill._7_1_ = (bVar1 ^ 0xffU) & 1;
  bVar2 = (byte)uStack_38;
  if (uStack_38 < 0x7e) {
    bVar4 = 0;
    if (fill._7_1_ != 0) {
      bVar4 = 0x80;
    }
    this->bytes[1] = bVar4 | bVar2;
    if (fill._7_1_ == 0) {
      local_48 = 2;
    }
    else {
      Mask::copyTo((Mask *)((long)&this_local + 4),this->bytes + 2);
      local_48 = 6;
    }
  }
  else {
    bVar3 = (byte)(uStack_38 >> 8);
    if (uStack_38 < 0x10000) {
      bVar4 = 0;
      if (fill._7_1_ != 0) {
        bVar4 = 0x80;
      }
      this->bytes[1] = bVar4 | 0x7e;
      this->bytes[2] = bVar3;
      this->bytes[3] = bVar2;
      if (fill._7_1_ == 0) {
        local_48 = 4;
      }
      else {
        Mask::copyTo((Mask *)((long)&this_local + 4),this->bytes + 4);
        local_48 = 8;
      }
    }
    else {
      bVar4 = 0;
      if (fill._7_1_ != 0) {
        bVar4 = 0x80;
      }
      this->bytes[1] = bVar4 | 0x7f;
      this->bytes[2] = (byte)(uStack_38 >> 0x38);
      this->bytes[3] = (byte)(uStack_38 >> 0x30);
      this->bytes[4] = (byte)(uStack_38 >> 0x28);
      this->bytes[5] = (byte)(uStack_38 >> 0x2a);
      this->bytes[6] = (byte)(uStack_38 >> 0x18);
      this->bytes[7] = (byte)(uStack_38 >> 0x10);
      this->bytes[8] = bVar3;
      this->bytes[9] = bVar2;
      if (fill._7_1_ == 0) {
        local_48 = 10;
      }
      else {
        Mask::copyTo((Mask *)((long)&this_local + 4),this->bytes + 10);
        local_48 = 0xe;
      }
    }
  }
  local_58 = arrayPtr<unsigned_char>(this->bytes,local_48);
  AVar5 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_58);
  return AVar5;
}

Assistant:

kj::ArrayPtr<const byte> compose(bool fin, bool compressed, byte opcode, uint64_t payloadLen,
        Mask mask) {
      bytes[0] = (fin ? FIN_MASK : 0) | (compressed ? RSV1_MASK : 0) | opcode;
      // Note that we can only set the compressed bit on DATA frames.
      bool hasMask = !mask.isZero();

      size_t fill;

      if (payloadLen < 126) {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | payloadLen;
        if (hasMask) {
          mask.copyTo(bytes + 2);
          fill = 6;
        } else {
          fill = 2;
        }
      } else if (payloadLen < 65536) {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | 126;
        bytes[2] = static_cast<byte>(payloadLen >> 8);
        bytes[3] = static_cast<byte>(payloadLen     );
        if (hasMask) {
          mask.copyTo(bytes + 4);
          fill = 8;
        } else {
          fill = 4;
        }
      } else {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | 127;
        bytes[2] = static_cast<byte>(payloadLen >> 56);
        bytes[3] = static_cast<byte>(payloadLen >> 48);
        bytes[4] = static_cast<byte>(payloadLen >> 40);
        bytes[5] = static_cast<byte>(payloadLen >> 42);
        bytes[6] = static_cast<byte>(payloadLen >> 24);
        bytes[7] = static_cast<byte>(payloadLen >> 16);
        bytes[8] = static_cast<byte>(payloadLen >>  8);
        bytes[9] = static_cast<byte>(payloadLen      );
        if (hasMask) {
          mask.copyTo(bytes + 10);
          fill = 14;
        } else {
          fill = 10;
        }
      }

      return arrayPtr(bytes, fill);
    }